

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall r_code::list<r_exec::Input>::push_front_new_cell(list<r_exec::Input> *this,Input *t)

{
  size_type sVar1;
  undefined1 local_50 [8];
  cell c;
  Input *t_local;
  list<r_exec::Input> *this_local;
  
  c.data.ijt = (uint64_t)t;
  cell::cell((cell *)local_50);
  r_exec::Input::operator=((Input *)&c.prev,(Input *)c.data.ijt);
  local_50 = (undefined1  [8])this->used_cells_head;
  c.next = -1;
  std::vector<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
  ::push_back(&this->cells,(value_type *)local_50);
  sVar1 = std::
          vector<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
          ::size(&this->cells);
  this->used_cells_head = sVar1 - 1;
  cell::~cell((cell *)local_50);
  return;
}

Assistant:

void push_front_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = used_cells_head;
        c.prev = null;
        cells.push_back(c);
        used_cells_head = cells.size() - 1;
    }